

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::bind_ip_address(socket_t sock,char *host)

{
  addrinfo *paVar1;
  int iVar2;
  addrinfo **__pai;
  bool bVar3;
  addrinfo *result;
  addrinfo *local_50;
  addrinfo local_48;
  
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 0;
  __pai = &local_50;
  iVar2 = getaddrinfo(host,"0",&local_48,__pai);
  if (iVar2 == 0) {
    do {
      paVar1 = *__pai;
      bVar3 = paVar1 != (addrinfo *)0x0;
      if (!bVar3) break;
      iVar2 = bind(sock,paVar1->ai_addr,paVar1->ai_addrlen);
      __pai = &paVar1->ai_next;
    } while (iVar2 != 0);
    freeaddrinfo(local_50);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool bind_ip_address(socket_t sock, const char *host) {
  struct addrinfo hints;
  struct addrinfo *result;

  memset(&hints, 0, sizeof(struct addrinfo));
  hints.ai_family = AF_UNSPEC;
  hints.ai_socktype = SOCK_STREAM;
  hints.ai_protocol = 0;

  if (getaddrinfo(host, "0", &hints, &result)) { return false; }

  auto ret = false;
  for (auto rp = result; rp; rp = rp->ai_next) {
    const auto &ai = *rp;
    if (!::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
      ret = true;
      break;
    }
  }

  freeaddrinfo(result);
  return ret;
}